

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_udmf.cpp
# Opt level: O0

void __thiscall UDMFParser::ParseLinedef(UDMFParser *this,line_t_conflict *ld,int index)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  double a;
  FName local_188;
  FName local_184;
  undefined1 auStack_180 [8];
  maplinedef_t mld;
  int saved;
  undefined1 local_160 [8];
  FScanner sc;
  char *str;
  FName key;
  FString tagstring;
  int lineid;
  FString local_30;
  FString arg1str;
  FString arg0str;
  bool strifetrans2;
  bool strifetrans;
  bool passuse;
  int index_local;
  line_t_conflict *ld_local;
  UDMFParser *this_local;
  
  arg0str.Chars._3_1_ = false;
  arg0str.Chars._2_1_ = false;
  arg0str.Chars._1_1_ = false;
  FString::FString(&arg1str);
  FString::FString(&local_30);
  FString::FString((FString *)&stack0xffffffffffffffb8);
  memset(ld,0,0x98);
  ld->alpha = 1.0;
  ld->portalindex = 0xffffffff;
  ld->sidedef[1] = (side_t *)0x0;
  ld->sidedef[0] = (side_t *)0x0;
  if ((::level.flags2 & 0x200) != 0) {
    ld->flags = ld->flags | 0x80000;
  }
  if ((::level.flags2 & 0x400) != 0) {
    ld->flags = ld->flags | 0x100000;
  }
  if ((::level.flags2 & 0x800) != 0) {
    ld->flags = ld->flags | 0x400000;
  }
  FScanner::MustGetToken((FScanner *)this,0x7b);
LAB_0061276f:
  bVar1 = FScanner::CheckToken((FScanner *)this,0x7d);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    bVar1 = FString::IsNotEmpty((FString *)&stack0xffffffffffffffb8);
    if (bVar1) {
      FScanner::FScanner((FScanner *)local_160);
      FString::FString((FString *)&stack0xfffffffffffffe98,(FString *)&stack0xffffffffffffffb8);
      FScanner::OpenString((FScanner *)local_160,"tagstring",(FString *)&stack0xfffffffffffffe98);
      FString::~FString((FString *)&stack0xfffffffffffffe98);
      while (bVar1 = FScanner::CheckNumber((FScanner *)local_160), bVar1) {
        if (sc.StringLen != 0) {
          FTagManager::AddLineID(&tagManager,index,sc.StringLen);
        }
      }
      FScanner::~FScanner((FScanner *)local_160);
    }
    if ((this->isTranslated & 1U) != 0) {
      unique0x00011f80 = ld->flags;
      mld.v2 = 0;
      mld.flags = 0;
      auStack_180._0_2_ = 0;
      auStack_180._2_2_ = 0;
      auStack_180._4_2_ = 0;
      auStack_180._6_2_ = (undefined2)ld->special;
      mld.v1 = (WORD)ld->args[0];
      P_TranslateLineDef((line_t *)ld,(maplinedef_t *)auStack_180,-1);
      ld->flags = stack0xfffffffffffffe94 | ld->flags & 0x802200;
    }
    if ((arg0str.Chars._3_1_ != false) && ((ld->activation & 2) != 0)) {
      ld->activation = ld->activation & 0xfffffffd | 0x40;
    }
    if (((arg0str.Chars._2_1_ != false) && (ld->alpha == 1.0)) && (!NAN(ld->alpha))) {
      ld->alpha = 0.75;
    }
    if (((arg0str.Chars._1_1_ != false) && (ld->alpha == 65536.0)) && (!NAN(ld->alpha))) {
      ld->alpha = 0.25;
    }
    if (ld->sidedef[0] == (side_t *)0x0) {
      ld->sidedef[0] = (side_t *)0x1;
      Printf("Line %d has no first side.\n",(ulong)(uint)index);
    }
    bVar1 = FString::IsNotEmpty(&arg1str);
    if ((bVar1) && ((bVar1 = P_IsACSSpecial(ld->special), bVar1 || (ld->special == 0)))) {
      FName::FName(&local_184,&arg1str);
      iVar3 = FName::operator_cast_to_int(&local_184);
      ld->args[0] = -iVar3;
    }
    bVar1 = FString::IsNotEmpty(&local_30);
    if ((bVar1) && ((bVar1 = P_IsThingSpecial(ld->special), bVar1 || (ld->special == 0)))) {
      FName::FName(&local_188,&local_30);
      iVar3 = FName::operator_cast_to_int(&local_188);
      ld->args[1] = -iVar3;
    }
    if (((ld->flags & 0x10000000) != 0) && ((ld->flags & 0x200000) == 0)) {
      Printf("Line %d has midtex3dimpassible without midtex3d.\n",(ulong)(uint)index);
    }
    FString::~FString((FString *)&stack0xffffffffffffffb8);
    FString::~FString(&local_30);
    FString::~FString(&arg1str);
    return;
  }
  UDMFParserBase::ParseKey((UDMFParserBase *)((long)&str + 4),SUB81(this,0),(bool *)0x0);
  iVar3 = FName::operator_cast_to_int((FName *)((long)&str + 4));
  switch(iVar3) {
  case 0xed:
    pcVar4 = FName::operator_cast_to_char_((FName *)((long)&str + 4));
    iVar3 = UDMFParserBase::CheckInt(&this->super_UDMFParserBase,pcVar4);
    ld->special = iVar3;
    bVar1 = FName::operator==(&(this->super_UDMFParserBase).namespc,NAME_Hexen);
    if ((bVar1) &&
       (((ld->special < 0 || (0x8c < ld->special)) || (HexenLineSpecialOk[ld->special] == '\0')))) {
      ld->special = 0;
    }
    goto LAB_0061276f;
  default:
    break;
  case 0x118:
  case 0x119:
  case 0x11a:
  case 0x11b:
  case 0x11c:
    pcVar4 = FName::operator_cast_to_char_((FName *)((long)&str + 4));
    iVar3 = UDMFParserBase::CheckInt(&this->super_UDMFParserBase,pcVar4);
    iVar2 = FName::operator_cast_to_int((FName *)((long)&str + 4));
    ld->args[iVar2 + -0x118] = iVar3;
    goto LAB_0061276f;
  case 0x11d:
    if (((this->super_UDMFParserBase).namespace_bits & 0x10U) != 0) {
      pcVar4 = FName::operator_cast_to_char_((FName *)((long)&str + 4));
      pcVar4 = UDMFParserBase::CheckString(&this->super_UDMFParserBase,pcVar4);
      FString::operator=(&arg1str,pcVar4);
      goto LAB_0061276f;
    }
    break;
  case 0x11e:
    if (((this->super_UDMFParserBase).namespace_bits & 0x10U) != 0) {
      pcVar4 = FName::operator_cast_to_char_((FName *)((long)&str + 4));
      pcVar4 = UDMFParserBase::CheckString(&this->super_UDMFParserBase,pcVar4);
      FString::operator=(&local_30,pcVar4);
      goto LAB_0061276f;
    }
    break;
  case 0x11f:
    pcVar4 = FName::operator_cast_to_char_((FName *)((long)&str + 4));
    iVar3 = UDMFParserBase::CheckInt(&this->super_UDMFParserBase,pcVar4);
    FTagManager::AddLineID(&tagManager,index,iVar3);
    goto LAB_0061276f;
  case 0x121:
    pcVar4 = FName::operator_cast_to_char_((FName *)((long)&str + 4));
    iVar3 = UDMFParserBase::CheckInt(&this->super_UDMFParserBase,pcVar4);
    ld->v1 = (vertex_t *)(long)iVar3;
    goto LAB_0061276f;
  case 0x122:
    pcVar4 = FName::operator_cast_to_char_((FName *)((long)&str + 4));
    iVar3 = UDMFParserBase::CheckInt(&this->super_UDMFParserBase,pcVar4);
    ld->v2 = (vertex_t *)(long)iVar3;
    goto LAB_0061276f;
  case 0x123:
    pcVar4 = FName::operator_cast_to_char_((FName *)((long)&str + 4));
    iVar3 = UDMFParserBase::CheckInt(&this->super_UDMFParserBase,pcVar4);
    ld->sidedef[0] = (side_t *)(long)(iVar3 + 1);
    goto LAB_0061276f;
  case 0x124:
    pcVar4 = FName::operator_cast_to_char_((FName *)((long)&str + 4));
    iVar3 = UDMFParserBase::CheckInt(&this->super_UDMFParserBase,pcVar4);
    ld->sidedef[1] = (side_t *)(long)(iVar3 + 1);
    goto LAB_0061276f;
  case 0x159:
    if (((this->super_UDMFParserBase).namespace_bits & 0x78U) != 0) {
      pcVar4 = FName::operator_cast_to_char_((FName *)((long)&str + 4));
      arg0str.Chars._2_1_ = UDMFParserBase::CheckBool(&this->super_UDMFParserBase,pcVar4);
      goto LAB_0061276f;
    }
    break;
  case 0x168:
    pcVar4 = FName::operator_cast_to_char_((FName *)((long)&str + 4));
    UDMFParserBase::Flag<unsigned_int>(&this->super_UDMFParserBase,&ld->flags,1,pcVar4);
    goto LAB_0061276f;
  case 0x169:
    pcVar4 = FName::operator_cast_to_char_((FName *)((long)&str + 4));
    UDMFParserBase::Flag<unsigned_int>(&this->super_UDMFParserBase,&ld->flags,2,pcVar4);
    goto LAB_0061276f;
  case 0x16a:
    pcVar4 = FName::operator_cast_to_char_((FName *)((long)&str + 4));
    UDMFParserBase::Flag<unsigned_int>(&this->super_UDMFParserBase,&ld->flags,4,pcVar4);
    goto LAB_0061276f;
  case 0x16b:
    pcVar4 = FName::operator_cast_to_char_((FName *)((long)&str + 4));
    UDMFParserBase::Flag<unsigned_int>(&this->super_UDMFParserBase,&ld->flags,8,pcVar4);
    goto LAB_0061276f;
  case 0x16c:
    pcVar4 = FName::operator_cast_to_char_((FName *)((long)&str + 4));
    UDMFParserBase::Flag<unsigned_int>(&this->super_UDMFParserBase,&ld->flags,0x10,pcVar4);
    goto LAB_0061276f;
  case 0x16d:
    pcVar4 = FName::operator_cast_to_char_((FName *)((long)&str + 4));
    UDMFParserBase::Flag<unsigned_int>(&this->super_UDMFParserBase,&ld->flags,0x20,pcVar4);
    goto LAB_0061276f;
  case 0x16e:
    pcVar4 = FName::operator_cast_to_char_((FName *)((long)&str + 4));
    UDMFParserBase::Flag<unsigned_int>(&this->super_UDMFParserBase,&ld->flags,0x40,pcVar4);
    goto LAB_0061276f;
  case 0x16f:
    pcVar4 = FName::operator_cast_to_char_((FName *)((long)&str + 4));
    UDMFParserBase::Flag<unsigned_int>(&this->super_UDMFParserBase,&ld->flags,0x80,pcVar4);
    goto LAB_0061276f;
  case 0x170:
    pcVar4 = FName::operator_cast_to_char_((FName *)((long)&str + 4));
    UDMFParserBase::Flag<unsigned_int>(&this->super_UDMFParserBase,&ld->flags,0x100,pcVar4);
    goto LAB_0061276f;
  case 0x175:
    if (((this->super_UDMFParserBase).namespace_bits & 0x78U) != 0) {
      pcVar4 = FName::operator_cast_to_char_((FName *)((long)&str + 4));
      UDMFParserBase::Flag<unsigned_int>(&this->super_UDMFParserBase,&ld->flags,0x20000,pcVar4);
      goto LAB_0061276f;
    }
    break;
  case 0x176:
    if (((this->super_UDMFParserBase).namespace_bits & 0x78U) != 0) {
      pcVar4 = FName::operator_cast_to_char_((FName *)((long)&str + 4));
      UDMFParserBase::Flag<unsigned_int>(&this->super_UDMFParserBase,&ld->flags,0x40000,pcVar4);
      goto LAB_0061276f;
    }
    break;
  case 0x17c:
    if (((this->super_UDMFParserBase).namespace_bits & 0x78U) != 0) {
      pcVar4 = FName::operator_cast_to_char_((FName *)((long)&str + 4));
      arg0str.Chars._1_1_ = UDMFParserBase::CheckBool(&this->super_UDMFParserBase,pcVar4);
      goto LAB_0061276f;
    }
    break;
  case 0x17d:
    if (((this->super_UDMFParserBase).namespace_bits & 0x71U) == 0) break;
    pcVar4 = FName::operator_cast_to_char_((FName *)((long)&str + 4));
    arg0str.Chars._3_1_ = UDMFParserBase::CheckBool(&this->super_UDMFParserBase,pcVar4);
    goto LAB_0061276f;
  }
  if ((this->isTranslated & 1U) == 0) {
    iVar3 = FName::operator_cast_to_int((FName *)((long)&str + 4));
    switch(iVar3) {
    case 0x17e:
      pcVar4 = FName::operator_cast_to_char_((FName *)((long)&str + 4));
      UDMFParserBase::Flag<unsigned_int>(&this->super_UDMFParserBase,&ld->flags,0x200,pcVar4);
      goto LAB_0061276f;
    default:
      break;
    case 0x182:
      pcVar4 = FName::operator_cast_to_char_((FName *)((long)&str + 4));
      UDMFParserBase::Flag<unsigned_int>(&this->super_UDMFParserBase,&ld->activation,1,pcVar4);
      goto LAB_0061276f;
    case 0x183:
      pcVar4 = FName::operator_cast_to_char_((FName *)((long)&str + 4));
      UDMFParserBase::Flag<unsigned_int>(&this->super_UDMFParserBase,&ld->activation,2,pcVar4);
      goto LAB_0061276f;
    case 0x184:
      pcVar4 = FName::operator_cast_to_char_((FName *)((long)&str + 4));
      UDMFParserBase::Flag<unsigned_int>(&this->super_UDMFParserBase,&ld->activation,0x400,pcVar4);
      goto LAB_0061276f;
    case 0x185:
      pcVar4 = FName::operator_cast_to_char_((FName *)((long)&str + 4));
      UDMFParserBase::Flag<unsigned_int>(&this->super_UDMFParserBase,&ld->activation,4,pcVar4);
      goto LAB_0061276f;
    case 0x186:
      pcVar4 = FName::operator_cast_to_char_((FName *)((long)&str + 4));
      UDMFParserBase::Flag<unsigned_int>(&this->super_UDMFParserBase,&ld->activation,8,pcVar4);
      goto LAB_0061276f;
    case 0x187:
      pcVar4 = FName::operator_cast_to_char_((FName *)((long)&str + 4));
      UDMFParserBase::Flag<unsigned_int>(&this->super_UDMFParserBase,&ld->activation,0x10,pcVar4);
      goto LAB_0061276f;
    case 0x188:
      pcVar4 = FName::operator_cast_to_char_((FName *)((long)&str + 4));
      UDMFParserBase::Flag<unsigned_int>(&this->super_UDMFParserBase,&ld->activation,0x20,pcVar4);
      goto LAB_0061276f;
    case 0x18a:
      pcVar4 = FName::operator_cast_to_char_((FName *)((long)&str + 4));
      UDMFParserBase::Flag<unsigned_int>(&this->super_UDMFParserBase,&ld->activation,0x100,pcVar4);
      goto LAB_0061276f;
    case 0x18b:
      pcVar4 = FName::operator_cast_to_char_((FName *)((long)&str + 4));
      UDMFParserBase::Flag<unsigned_int>(&this->super_UDMFParserBase,&ld->activation,0x200,pcVar4);
      goto LAB_0061276f;
    }
  }
  if (((this->super_UDMFParserBase).namespace_bits & 0x70U) != 0) {
    iVar3 = FName::operator_cast_to_int((FName *)((long)&str + 4));
    if (iVar3 == 0xe6) {
      pcVar4 = FName::operator_cast_to_char_((FName *)((long)&str + 4));
      a = UDMFParserBase::CheckFloat(&this->super_UDMFParserBase,pcVar4);
      line_t::setAlpha((line_t *)ld,a);
      goto LAB_0061276f;
    }
    if (iVar3 == 0x120) {
      pcVar4 = FName::operator_cast_to_char_((FName *)((long)&str + 4));
      pcVar4 = UDMFParserBase::CheckString(&this->super_UDMFParserBase,pcVar4);
      FString::operator=((FString *)&stack0xffffffffffffffb8,pcVar4);
    }
    else {
      if (iVar3 == 0x171) {
        pcVar4 = FName::operator_cast_to_char_((FName *)((long)&str + 4));
        UDMFParserBase::Flag<unsigned_int>(&this->super_UDMFParserBase,&ld->flags,0x2000,pcVar4);
        goto LAB_0061276f;
      }
      if (iVar3 == 0x172) {
        pcVar4 = FName::operator_cast_to_char_((FName *)((long)&str + 4));
        UDMFParserBase::Flag<unsigned_int>(&this->super_UDMFParserBase,&ld->flags,0x4000,pcVar4);
        goto LAB_0061276f;
      }
      if (iVar3 == 0x173) {
        pcVar4 = FName::operator_cast_to_char_((FName *)((long)&str + 4));
        UDMFParserBase::Flag<unsigned_int>(&this->super_UDMFParserBase,&ld->flags,0x8000,pcVar4);
        goto LAB_0061276f;
      }
      if (iVar3 == 0x174) {
        pcVar4 = FName::operator_cast_to_char_((FName *)((long)&str + 4));
        UDMFParserBase::Flag<unsigned_int>(&this->super_UDMFParserBase,&ld->flags,0x10000,pcVar4);
        goto LAB_0061276f;
      }
      if (iVar3 == 0x177) {
        pcVar4 = FName::operator_cast_to_char_((FName *)((long)&str + 4));
        UDMFParserBase::Flag<unsigned_int>(&this->super_UDMFParserBase,&ld->flags,0x80000,pcVar4);
        goto LAB_0061276f;
      }
      if (iVar3 == 0x178) {
        pcVar4 = FName::operator_cast_to_char_((FName *)((long)&str + 4));
        UDMFParserBase::Flag<unsigned_int>(&this->super_UDMFParserBase,&ld->flags,0x100000,pcVar4);
        goto LAB_0061276f;
      }
      if (iVar3 == 0x179) {
        pcVar4 = FName::operator_cast_to_char_((FName *)((long)&str + 4));
        UDMFParserBase::Flag<unsigned_int>(&this->super_UDMFParserBase,&ld->flags,0x200000,pcVar4);
        goto LAB_0061276f;
      }
      if (iVar3 == 0x17a) {
        pcVar4 = FName::operator_cast_to_char_((FName *)((long)&str + 4));
        UDMFParserBase::Flag<unsigned_int>(&this->super_UDMFParserBase,&ld->flags,0x400000,pcVar4);
        goto LAB_0061276f;
      }
      if (iVar3 == 0x17b) {
        pcVar4 = FName::operator_cast_to_char_((FName *)((long)&str + 4));
        UDMFParserBase::Flag<unsigned_int>(&this->super_UDMFParserBase,&ld->flags,0x800000,pcVar4);
        goto LAB_0061276f;
      }
      if (iVar3 == 0x180) {
        pcVar4 = FName::operator_cast_to_char_((FName *)((long)&str + 4));
        iVar3 = UDMFParserBase::CheckInt(&this->super_UDMFParserBase,pcVar4);
        ld->locknumber = iVar3;
        goto LAB_0061276f;
      }
      if (iVar3 == 0x181) {
        pcVar4 = FName::operator_cast_to_char_((FName *)((long)&str + 4));
        UDMFParserBase::Flag<unsigned_int>(&this->super_UDMFParserBase,&ld->flags,0x10000000,pcVar4)
        ;
        goto LAB_0061276f;
      }
      if (iVar3 == 0x189) {
        pcVar4 = FName::operator_cast_to_char_((FName *)((long)&str + 4));
        UDMFParserBase::Flag<unsigned_int>(&this->super_UDMFParserBase,&ld->activation,0x80,pcVar4);
        goto LAB_0061276f;
      }
      if (iVar3 == 0x1c8) {
        pcVar4 = FName::operator_cast_to_char_((FName *)((long)&str + 4));
        UDMFParserBase::Flag<unsigned_int>(&this->super_UDMFParserBase,&ld->flags,0x1000000,pcVar4);
        goto LAB_0061276f;
      }
      if (iVar3 == 0x1c9) {
        pcVar4 = FName::operator_cast_to_char_((FName *)((long)&str + 4));
        UDMFParserBase::Flag<unsigned_int>(&this->super_UDMFParserBase,&ld->flags,0x2000000,pcVar4);
        goto LAB_0061276f;
      }
      if (iVar3 == 0x1cb) {
        pcVar4 = FName::operator_cast_to_char_((FName *)((long)&str + 4));
        UDMFParserBase::Flag<unsigned_int>(&this->super_UDMFParserBase,&ld->flags,0x4000000,pcVar4);
        goto LAB_0061276f;
      }
      if (iVar3 == 0x1cc) {
        pcVar4 = FName::operator_cast_to_char_((FName *)((long)&str + 4));
        UDMFParserBase::Flag<unsigned_int>(&this->super_UDMFParserBase,&ld->flags,0x8000000,pcVar4);
        goto LAB_0061276f;
      }
      if (iVar3 == 0x1cd) {
        pcVar4 = FName::operator_cast_to_char_((FName *)((long)&str + 4));
        pcVar4 = UDMFParserBase::CheckString(&this->super_UDMFParserBase,pcVar4);
        iVar3 = strcasecmp(pcVar4,"translucent");
        if (iVar3 == 0) {
          ld->flags = ld->flags & 0xfffffbff;
        }
        else {
          iVar3 = strcasecmp(pcVar4,"add");
          if (iVar3 == 0) {
            ld->flags = ld->flags | 0x400;
          }
          else {
            FScanner::ScriptMessage
                      ((FScanner *)this,"Unknown value \"%s\" for \'renderstyle\'\n",pcVar4);
          }
        }
        goto LAB_0061276f;
      }
    }
  }
  if (((this->super_UDMFParserBase).namespace_bits & 0x30U) != 0) {
    pcVar4 = FName::GetChars((FName *)((long)&str + 4));
    iVar3 = strncasecmp("user_",pcVar4,5);
    if (iVar3 == 0) {
      FName::FName((FName *)&sc.CMode,(FName *)((long)&str + 4));
      AddUserKey(this,(FName *)&sc.CMode,0,index);
    }
  }
  goto LAB_0061276f;
}

Assistant:

void ParseLinedef(line_t *ld, int index)
	{
		bool passuse = false;
		bool strifetrans = false;
		bool strifetrans2 = false;
		FString arg0str, arg1str;
		int lineid = -1;	// forZDoomTranslated namespace
		FString tagstring;

		memset(ld, 0, sizeof(*ld));
		ld->alpha = 1.;
		ld->portalindex = UINT_MAX;
		ld->sidedef[0] = ld->sidedef[1] = NULL;
		if (level.flags2 & LEVEL2_CLIPMIDTEX) ld->flags |= ML_CLIP_MIDTEX;
		if (level.flags2 & LEVEL2_WRAPMIDTEX) ld->flags |= ML_WRAP_MIDTEX;
		if (level.flags2 & LEVEL2_CHECKSWITCHRANGE) ld->flags |= ML_CHECKSWITCHRANGE;

		sc.MustGetToken('{');
		while (!sc.CheckToken('}'))
		{
			FName key = ParseKey();

			// This switch contains all keys of the UDMF base spec
			switch(key)
			{
			case NAME_V1:
				ld->v1 = (vertex_t*)(intptr_t)CheckInt(key);	// must be relocated later
				continue;

			case NAME_V2:
				ld->v2 = (vertex_t*)(intptr_t)CheckInt(key);	// must be relocated later
				continue;

			case NAME_Special:
				ld->special = CheckInt(key);
				if (namespc == NAME_Hexen)
				{
					if (ld->special < 0 || ld->special > 140 || !HexenLineSpecialOk[ld->special])
						ld->special = 0;	// NULL all specials which don't exist in Hexen
				}

				continue;

			case NAME_Id:
				lineid = CheckInt(key);
				tagManager.AddLineID(index, lineid);
				continue;

			case NAME_Sidefront:
				ld->sidedef[0] = (side_t*)(intptr_t)(1 + CheckInt(key));
				continue;

			case NAME_Sideback:
				ld->sidedef[1] = (side_t*)(intptr_t)(1 + CheckInt(key));
				continue;

			case NAME_Arg0:
			case NAME_Arg1:
			case NAME_Arg2:
			case NAME_Arg3:
			case NAME_Arg4:
				ld->args[int(key)-int(NAME_Arg0)] = CheckInt(key);
				continue;

			case NAME_Arg0Str:
				CHECK_N(Zd);
				arg0str = CheckString(key);
				continue;

			case NAME_Arg1Str:
				CHECK_N(Zd);
				arg1str = CheckString(key);
				continue;

			case NAME_Blocking:
				Flag(ld->flags, ML_BLOCKING, key); 
				continue;

			case NAME_Blockmonsters:
				Flag(ld->flags, ML_BLOCKMONSTERS, key); 
				continue;

			case NAME_Twosided:
				Flag(ld->flags, ML_TWOSIDED, key); 
				continue;

			case NAME_Dontpegtop:
				Flag(ld->flags, ML_DONTPEGTOP, key); 
				continue;

			case NAME_Dontpegbottom:
				Flag(ld->flags, ML_DONTPEGBOTTOM, key); 
				continue;

			case NAME_Secret:
				Flag(ld->flags, ML_SECRET, key); 
				continue;

			case NAME_Blocksound:
				Flag(ld->flags, ML_SOUNDBLOCK, key); 
				continue;

			case NAME_Dontdraw:
				Flag(ld->flags, ML_DONTDRAW, key); 
				continue;

			case NAME_Mapped:
				Flag(ld->flags, ML_MAPPED, key); 
				continue;

			case NAME_Jumpover:
				CHECK_N(St | Zd | Zdt | Va)
				Flag(ld->flags, ML_RAILING, key); 
				continue;

			case NAME_Blockfloaters:
				CHECK_N(St | Zd | Zdt | Va)
				Flag(ld->flags, ML_BLOCK_FLOATERS, key); 
				continue;

			case NAME_Translucent:
				CHECK_N(St | Zd | Zdt | Va)
				strifetrans = CheckBool(key); 
				continue;

			case NAME_Transparent:
				CHECK_N(St | Zd | Zdt | Va)
				strifetrans2 = CheckBool(key); 
				continue;

			case NAME_Passuse:
				CHECK_N(Dm | Zd | Zdt | Va)
				passuse = CheckBool(key); 
				continue;

			default:
				break;
			}

			// This switch contains all keys of the UDMF base spec which only apply to Hexen format specials
			if (!isTranslated) switch (key)
			{
			case NAME_Playercross:
				Flag(ld->activation, SPAC_Cross, key); 
				continue;

			case NAME_Playeruse:
				Flag(ld->activation, SPAC_Use, key); 
				continue;

			case NAME_Playeruseback:
				Flag(ld->activation, SPAC_UseBack, key); 
				continue;

			case NAME_Monstercross:
				Flag(ld->activation, SPAC_MCross, key); 
				continue;

			case NAME_Impact:
				Flag(ld->activation, SPAC_Impact, key); 
				continue;

			case NAME_Playerpush:
				Flag(ld->activation, SPAC_Push, key); 
				continue;

			case NAME_Missilecross:
				Flag(ld->activation, SPAC_PCross, key); 
				continue;

			case NAME_Monsteruse:
				Flag(ld->activation, SPAC_MUse, key); 
				continue;

			case NAME_Monsterpush:
				Flag(ld->activation, SPAC_MPush, key); 
				continue;

			case NAME_Repeatspecial:
				Flag(ld->flags, ML_REPEAT_SPECIAL, key); 
				continue;

			default:
				break;
			}

			// This switch contains all keys which are ZDoom specific
			if (namespace_bits & (Zd|Zdt|Va)) switch(key)
			{
			case NAME_Alpha:
				ld->setAlpha(CheckFloat(key));
				continue;

			case NAME_Renderstyle:
			{
				const char *str = CheckString(key);
				if (!stricmp(str, "translucent")) ld->flags &= ~ML_ADDTRANS;
				else if (!stricmp(str, "add")) ld->flags |= ML_ADDTRANS;
				else sc.ScriptMessage("Unknown value \"%s\" for 'renderstyle'\n", str);
				continue;
			}

			case NAME_Anycross:
				Flag(ld->activation, SPAC_AnyCross, key); 
				continue;

			case NAME_Monsteractivate:
				Flag(ld->flags, ML_MONSTERSCANACTIVATE, key); 
				continue;

			case NAME_Blockplayers:
				Flag(ld->flags, ML_BLOCK_PLAYERS, key); 
				continue;

			case NAME_Blockeverything:
				Flag(ld->flags, ML_BLOCKEVERYTHING, key); 
				continue;

			case NAME_Zoneboundary:
				Flag(ld->flags, ML_ZONEBOUNDARY, key); 
				continue;

			case NAME_Clipmidtex:
				Flag(ld->flags, ML_CLIP_MIDTEX, key); 
				continue;

			case NAME_Wrapmidtex:
				Flag(ld->flags, ML_WRAP_MIDTEX, key); 
				continue;

			case NAME_Midtex3d:
				Flag(ld->flags, ML_3DMIDTEX, key); 
				continue;

			case NAME_Checkswitchrange:
				Flag(ld->flags, ML_CHECKSWITCHRANGE, key); 
				continue;

			case NAME_Firstsideonly:
				Flag(ld->flags, ML_FIRSTSIDEONLY, key); 
				continue;

			case NAME_blockprojectiles:
				Flag(ld->flags, ML_BLOCKPROJECTILE, key); 
				continue;

			case NAME_blockuse:
				Flag(ld->flags, ML_BLOCKUSE, key); 
				continue;

			case NAME_blocksight:
				Flag(ld->flags, ML_BLOCKSIGHT, key); 
				continue;
			
			case NAME_blockhitscan:
				Flag(ld->flags, ML_BLOCKHITSCAN, key); 
				continue;
			
			// [TP] Locks the special with a key
			case NAME_Locknumber:
				ld->locknumber = CheckInt(key);
				continue;

			// [TP] Causes a 3d midtex to behave like an impassible line
			case NAME_Midtex3dimpassible:
				Flag(ld->flags, ML_3DMIDTEX_IMPASS, key);
				continue;

			case NAME_MoreIds:
				// delay parsing of the tag string until parsing of the sector is complete
				// This ensures that the ID is always the first tag in the list.
				tagstring = CheckString(key);
				break;


			default:
				break;
			}


			if ((namespace_bits & (Zd | Zdt)) && !strnicmp("user_", key.GetChars(), 5))
			{
				AddUserKey(key, UDMF_Line, index);
			}
		}

		if (tagstring.IsNotEmpty())
		{
			FScanner sc;
			sc.OpenString("tagstring", tagstring);
			// scan the string as long as valid numbers can be found
			while (sc.CheckNumber())
			{
				if (sc.Number != 0)	tagManager.AddLineID(index, sc.Number);
			}
		}

		if (isTranslated)
		{
			int saved = ld->flags;

			maplinedef_t mld;
			memset(&mld, 0, sizeof(mld));
			mld.special = ld->special;
			mld.tag = ld->args[0];
			P_TranslateLineDef(ld, &mld);
			ld->flags = saved | (ld->flags&(ML_MONSTERSCANACTIVATE|ML_REPEAT_SPECIAL|ML_FIRSTSIDEONLY));
		}
		if (passuse && (ld->activation & SPAC_Use)) 
		{
			ld->activation = (ld->activation & ~SPAC_Use) | SPAC_UseThrough;
		}
		if (strifetrans && ld->alpha == 1.)
		{
			ld->alpha = 0.75;
		}
		if (strifetrans2 && ld->alpha == OPAQUE)
		{
			ld->alpha = 0.25;
		}
		if (ld->sidedef[0] == NULL)
		{
			ld->sidedef[0] = (side_t*)(intptr_t)(1);
			Printf("Line %d has no first side.\n", index);
		}
		if (arg0str.IsNotEmpty() && (P_IsACSSpecial(ld->special) || ld->special == 0))
		{
			ld->args[0] = -FName(arg0str);
		}
		if (arg1str.IsNotEmpty() && (P_IsThingSpecial(ld->special) || ld->special == 0))
		{
			ld->args[1] = -FName(arg1str);
		}
		if ((ld->flags & ML_3DMIDTEX_IMPASS) && !(ld->flags & ML_3DMIDTEX)) // [TP]
		{
			Printf ("Line %d has midtex3dimpassible without midtex3d.\n", index);
		}
	}